

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinusExpression.cpp
# Opt level: O2

BaseExpressionPtr __thiscall
Kandinsky::MinusExpression::derivative(MinusExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseExpressionPtr BVar1;
  shared_ptr<Kandinsky::BaseExpression> sStack_38;
  UnaryExpression local_28;
  
  (*((variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&sStack_38);
  operator-<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((MinusExpression *)&local_28,&sStack_38);
  makePtr2<Kandinsky::MinusExpression>(this,&local_28);
  UnaryExpression::~UnaryExpression(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_38.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr MinusExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(- m_arg->derivative(variable));
    }